

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_258d18e::CheckPathParametersEx
          (anon_unknown_dwarf_258d18e *this,cmGeneratorExpressionContext *ctx,
          GeneratorExpressionContent *cnt,string_view option,size_t count,int required,bool exactly)

{
  byte bVar1;
  int iVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_140;
  string local_120;
  undefined8 local_100;
  undefined1 *local_f8;
  undefined1 local_f0 [32];
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  GeneratorExpressionContent *local_90;
  size_t local_88;
  undefined8 local_80;
  char *local_78;
  long local_70;
  char *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  long local_50;
  char *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  
  iVar2 = (int)count;
  bVar1 = iVar2 < (int)option._M_str & (byte)required | (int)option._M_str < iVar2;
  if (bVar1 == 1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_120,(GeneratorExpressionContent *)ctx);
    local_68 = "at least";
    if ((byte)required != 0) {
      local_68 = "exactly";
    }
    local_70 = 8 - (ulong)(byte)required;
    local_48 = "two parameters";
    if (iVar2 == 1) {
      local_48 = "one parameter";
    }
    local_a0._M_len = 7;
    local_a0._M_str = "$<PATH:";
    local_80 = 0x16;
    local_78 = "> expression requires ";
    local_c8 = local_c0;
    local_d0 = 1;
    local_c0[0] = 0x20;
    local_60 = 1;
    local_50 = (ulong)(iVar2 != 1) + 0xd;
    local_f8 = local_f0;
    local_100 = 1;
    local_f0[0] = 0x2e;
    local_40 = 1;
    views._M_len = 7;
    views._M_array = &local_a0;
    local_90 = cnt;
    local_88 = option._M_len;
    local_58 = local_c8;
    local_38 = local_f8;
    cmCatViews_abi_cxx11_(&local_140,views);
    reportError((cmGeneratorExpressionContext *)this,&local_120,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool CheckPathParametersEx(cmGeneratorExpressionContext* ctx,
                           const GeneratorExpressionContent* cnt,
                           cm::string_view option, std::size_t count,
                           int required = 1, bool exactly = true)
{
  if (static_cast<int>(count) < required ||
      (exactly && static_cast<int>(count) > required)) {
    reportError(ctx, cnt->GetOriginalExpression(),
                cmStrCat("$<PATH:", option, "> expression requires ",
                         (exactly ? "exactly" : "at least"), ' ',
                         (required == 1 ? "one parameter" : "two parameters"),
                         '.'));
    return false;
  }
  return true;
}